

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  ulong *puVar48;
  uint uVar49;
  ulong uVar50;
  long lVar51;
  long lVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  int iVar58;
  ulong *puVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  uint uVar72;
  uint uVar73;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  uint uVar74;
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar91;
  float fVar92;
  undefined1 auVar87 [16];
  float fVar93;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  NodeRef stack [564];
  undefined8 local_12b8;
  float fStack_12b0;
  float fStack_12ac;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  size_t local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = root.ptr;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar60._4_4_ = uVar2;
  auVar60._0_4_ = uVar2;
  auVar60._8_4_ = uVar2;
  auVar60._12_4_ = uVar2;
  auVar60._16_4_ = uVar2;
  auVar60._20_4_ = uVar2;
  auVar60._24_4_ = uVar2;
  auVar60._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar61._4_4_ = uVar2;
  auVar61._0_4_ = uVar2;
  auVar61._8_4_ = uVar2;
  auVar61._12_4_ = uVar2;
  auVar61._16_4_ = uVar2;
  auVar61._20_4_ = uVar2;
  auVar61._24_4_ = uVar2;
  auVar61._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar62._4_4_ = uVar2;
  auVar62._0_4_ = uVar2;
  auVar62._8_4_ = uVar2;
  auVar62._12_4_ = uVar2;
  auVar62._16_4_ = uVar2;
  auVar62._20_4_ = uVar2;
  auVar62._24_4_ = uVar2;
  auVar62._28_4_ = uVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar53 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar54 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar55 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar58 = (tray->tnear).field_0.i[k];
  auVar63._4_4_ = iVar58;
  auVar63._0_4_ = iVar58;
  auVar63._8_4_ = iVar58;
  auVar63._12_4_ = iVar58;
  auVar63._16_4_ = iVar58;
  auVar63._20_4_ = iVar58;
  auVar63._24_4_ = iVar58;
  auVar63._28_4_ = iVar58;
  iVar58 = (tray->tfar).field_0.i[k];
  auVar64._4_4_ = iVar58;
  auVar64._0_4_ = iVar58;
  auVar64._8_4_ = iVar58;
  auVar64._12_4_ = iVar58;
  auVar64._16_4_ = iVar58;
  auVar64._20_4_ = iVar58;
  auVar64._24_4_ = iVar58;
  auVar64._28_4_ = iVar58;
  puVar59 = local_11d0;
LAB_00fd5be8:
  do {
    puVar48 = puVar59;
    if (puVar48 == &local_11d8) {
LAB_00fd6045:
      return puVar48 != &local_11d8;
    }
    puVar59 = puVar48 + -1;
    uVar56 = puVar48[-1];
    while ((uVar56 & 8) == 0) {
      auVar17 = vsubps_avx(*(undefined1 (*) [32])(uVar56 + 0x40 + uVar53),auVar60);
      auVar18._4_4_ = auVar17._4_4_ * fVar3;
      auVar18._0_4_ = auVar17._0_4_ * fVar3;
      auVar18._8_4_ = auVar17._8_4_ * fVar3;
      auVar18._12_4_ = auVar17._12_4_ * fVar3;
      auVar18._16_4_ = auVar17._16_4_ * fVar3;
      auVar18._20_4_ = auVar17._20_4_ * fVar3;
      auVar18._24_4_ = auVar17._24_4_ * fVar3;
      auVar18._28_4_ = auVar17._28_4_;
      auVar17 = vsubps_avx(*(undefined1 (*) [32])(uVar56 + 0x40 + uVar54),auVar61);
      auVar19._4_4_ = auVar17._4_4_ * fVar4;
      auVar19._0_4_ = auVar17._0_4_ * fVar4;
      auVar19._8_4_ = auVar17._8_4_ * fVar4;
      auVar19._12_4_ = auVar17._12_4_ * fVar4;
      auVar19._16_4_ = auVar17._16_4_ * fVar4;
      auVar19._20_4_ = auVar17._20_4_ * fVar4;
      auVar19._24_4_ = auVar17._24_4_ * fVar4;
      auVar19._28_4_ = auVar17._28_4_;
      auVar17 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vsubps_avx(*(undefined1 (*) [32])(uVar56 + 0x40 + uVar55),auVar62);
      auVar20._4_4_ = auVar18._4_4_ * fVar5;
      auVar20._0_4_ = auVar18._0_4_ * fVar5;
      auVar20._8_4_ = auVar18._8_4_ * fVar5;
      auVar20._12_4_ = auVar18._12_4_ * fVar5;
      auVar20._16_4_ = auVar18._16_4_ * fVar5;
      auVar20._20_4_ = auVar18._20_4_ * fVar5;
      auVar20._24_4_ = auVar18._24_4_ * fVar5;
      auVar20._28_4_ = auVar18._28_4_;
      auVar18 = vmaxps_avx(auVar20,auVar63);
      auVar17 = vmaxps_avx(auVar17,auVar18);
      auVar18 = vsubps_avx(*(undefined1 (*) [32])(uVar56 + 0x40 + (uVar53 ^ 0x20)),auVar60);
      auVar21._4_4_ = auVar18._4_4_ * fVar3;
      auVar21._0_4_ = auVar18._0_4_ * fVar3;
      auVar21._8_4_ = auVar18._8_4_ * fVar3;
      auVar21._12_4_ = auVar18._12_4_ * fVar3;
      auVar21._16_4_ = auVar18._16_4_ * fVar3;
      auVar21._20_4_ = auVar18._20_4_ * fVar3;
      auVar21._24_4_ = auVar18._24_4_ * fVar3;
      auVar21._28_4_ = auVar18._28_4_;
      auVar18 = vsubps_avx(*(undefined1 (*) [32])(uVar56 + 0x40 + (uVar54 ^ 0x20)),auVar61);
      auVar22._4_4_ = auVar18._4_4_ * fVar4;
      auVar22._0_4_ = auVar18._0_4_ * fVar4;
      auVar22._8_4_ = auVar18._8_4_ * fVar4;
      auVar22._12_4_ = auVar18._12_4_ * fVar4;
      auVar22._16_4_ = auVar18._16_4_ * fVar4;
      auVar22._20_4_ = auVar18._20_4_ * fVar4;
      auVar22._24_4_ = auVar18._24_4_ * fVar4;
      auVar22._28_4_ = auVar18._28_4_;
      auVar18 = vminps_avx(auVar21,auVar22);
      auVar19 = vsubps_avx(*(undefined1 (*) [32])(uVar56 + 0x40 + (uVar55 ^ 0x20)),auVar62);
      auVar23._4_4_ = auVar19._4_4_ * fVar5;
      auVar23._0_4_ = auVar19._0_4_ * fVar5;
      auVar23._8_4_ = auVar19._8_4_ * fVar5;
      auVar23._12_4_ = auVar19._12_4_ * fVar5;
      auVar23._16_4_ = auVar19._16_4_ * fVar5;
      auVar23._20_4_ = auVar19._20_4_ * fVar5;
      auVar23._24_4_ = auVar19._24_4_ * fVar5;
      auVar23._28_4_ = auVar19._28_4_;
      auVar19 = vminps_avx(auVar23,auVar64);
      auVar18 = vminps_avx(auVar18,auVar19);
      auVar17 = vcmpps_avx(auVar17,auVar18,2);
      uVar49 = vmovmskps_avx(auVar17);
      if (uVar49 == 0) goto LAB_00fd5be8;
      uVar49 = uVar49 & 0xff;
      uVar50 = uVar56 & 0xfffffffffffffff0;
      lVar52 = 0;
      if (uVar49 != 0) {
        for (; (uVar49 >> lVar52 & 1) == 0; lVar52 = lVar52 + 1) {
        }
      }
      uVar56 = *(ulong *)(uVar50 + lVar52 * 8);
      uVar49 = uVar49 - 1 & uVar49;
      uVar57 = (ulong)uVar49;
      if (uVar49 != 0) {
        do {
          *puVar59 = uVar56;
          puVar59 = puVar59 + 1;
          lVar52 = 0;
          if (uVar57 != 0) {
            for (; (uVar57 >> lVar52 & 1) == 0; lVar52 = lVar52 + 1) {
            }
          }
          uVar56 = *(ulong *)(uVar50 + lVar52 * 8);
          uVar57 = uVar57 - 1 & uVar57;
        } while (uVar57 != 0);
      }
    }
    uVar50 = uVar56 & 0xfffffffffffffff0;
    for (lVar52 = 0; lVar52 != (ulong)((uint)uVar56 & 0xf) - 8; lVar52 = lVar52 + 1) {
      lVar51 = lVar52 * 0xb0;
      pfVar1 = (float *)(uVar50 + 0x80 + lVar51);
      fVar24 = *pfVar1;
      fVar25 = pfVar1[1];
      fVar26 = pfVar1[2];
      fVar27 = pfVar1[3];
      pfVar1 = (float *)(uVar50 + 0x40 + lVar51);
      fVar28 = *pfVar1;
      fVar29 = pfVar1[1];
      fVar30 = pfVar1[2];
      fVar31 = pfVar1[3];
      auVar75._0_4_ = fVar24 * fVar28;
      auVar75._4_4_ = fVar25 * fVar29;
      auVar75._8_4_ = fVar26 * fVar30;
      auVar75._12_4_ = fVar27 * fVar31;
      pfVar1 = (float *)(uVar50 + 0x70 + lVar51);
      fVar32 = *pfVar1;
      fVar33 = pfVar1[1];
      fVar34 = pfVar1[2];
      fVar35 = pfVar1[3];
      pfVar1 = (float *)(uVar50 + 0x50 + lVar51);
      fVar36 = *pfVar1;
      fVar37 = pfVar1[1];
      fVar38 = pfVar1[2];
      fVar39 = pfVar1[3];
      auVar87._0_4_ = fVar32 * fVar36;
      auVar87._4_4_ = fVar33 * fVar37;
      auVar87._8_4_ = fVar34 * fVar38;
      auVar87._12_4_ = fVar35 * fVar39;
      auVar75 = vsubps_avx(auVar87,auVar75);
      pfVar1 = (float *)(uVar50 + 0x60 + lVar51);
      fVar40 = *pfVar1;
      fVar41 = pfVar1[1];
      fVar42 = pfVar1[2];
      fVar43 = pfVar1[3];
      auVar76._0_4_ = fVar36 * fVar40;
      auVar76._4_4_ = fVar37 * fVar41;
      auVar76._8_4_ = fVar38 * fVar42;
      auVar76._12_4_ = fVar39 * fVar43;
      pfVar1 = (float *)(uVar50 + 0x30 + lVar51);
      fVar44 = *pfVar1;
      fVar45 = pfVar1[1];
      fVar46 = pfVar1[2];
      fVar47 = pfVar1[3];
      auVar65._0_4_ = fVar24 * fVar44;
      auVar65._4_4_ = fVar25 * fVar45;
      auVar65._8_4_ = fVar26 * fVar46;
      auVar65._12_4_ = fVar27 * fVar47;
      auVar65 = vsubps_avx(auVar65,auVar76);
      auVar66._0_4_ = fVar32 * fVar44;
      auVar66._4_4_ = fVar33 * fVar45;
      auVar66._8_4_ = fVar34 * fVar46;
      auVar66._12_4_ = fVar35 * fVar47;
      auVar77._0_4_ = fVar28 * fVar40;
      auVar77._4_4_ = fVar29 * fVar41;
      auVar77._8_4_ = fVar30 * fVar42;
      auVar77._12_4_ = fVar31 * fVar43;
      auVar76 = vsubps_avx(auVar77,auVar66);
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar67._4_4_ = uVar2;
      auVar67._0_4_ = uVar2;
      auVar67._8_4_ = uVar2;
      auVar67._12_4_ = uVar2;
      auVar66 = vsubps_avx(*(undefined1 (*) [16])(uVar50 + lVar51),auVar67);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar68._4_4_ = uVar2;
      auVar68._0_4_ = uVar2;
      auVar68._8_4_ = uVar2;
      auVar68._12_4_ = uVar2;
      auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar50 + 0x10 + lVar51),auVar68);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar69._4_4_ = uVar2;
      auVar69._0_4_ = uVar2;
      auVar69._8_4_ = uVar2;
      auVar69._12_4_ = uVar2;
      auVar68 = vsubps_avx(*(undefined1 (*) [16])(uVar50 + 0x20 + lVar51),auVar69);
      fVar6 = *(float *)(ray + k * 4 + 0x50);
      fVar7 = *(float *)(ray + k * 4 + 0x60);
      fVar9 = auVar68._0_4_;
      auVar94._0_4_ = fVar6 * fVar9;
      fVar11 = auVar68._4_4_;
      auVar94._4_4_ = fVar6 * fVar11;
      fVar13 = auVar68._8_4_;
      auVar94._8_4_ = fVar6 * fVar13;
      fVar15 = auVar68._12_4_;
      auVar94._12_4_ = fVar6 * fVar15;
      fVar10 = auVar67._0_4_;
      auVar80._0_4_ = fVar7 * fVar10;
      fVar12 = auVar67._4_4_;
      auVar80._4_4_ = fVar7 * fVar12;
      fVar14 = auVar67._8_4_;
      auVar80._8_4_ = fVar7 * fVar14;
      fVar16 = auVar67._12_4_;
      auVar80._12_4_ = fVar7 * fVar16;
      auVar67 = vsubps_avx(auVar80,auVar94);
      fVar8 = *(float *)(ray + k * 4 + 0x40);
      fVar86 = auVar66._0_4_;
      auVar95._0_4_ = fVar86 * fVar7;
      fVar91 = auVar66._4_4_;
      auVar95._4_4_ = fVar91 * fVar7;
      fVar92 = auVar66._8_4_;
      auVar95._8_4_ = fVar92 * fVar7;
      fVar93 = auVar66._12_4_;
      auVar95._12_4_ = fVar93 * fVar7;
      auVar83._0_4_ = fVar8 * fVar9;
      auVar83._4_4_ = fVar8 * fVar11;
      auVar83._8_4_ = fVar8 * fVar13;
      auVar83._12_4_ = fVar8 * fVar15;
      auVar66 = vsubps_avx(auVar83,auVar95);
      auVar84._0_4_ = fVar8 * fVar10;
      auVar84._4_4_ = fVar8 * fVar12;
      auVar84._8_4_ = fVar8 * fVar14;
      auVar84._12_4_ = fVar8 * fVar16;
      auVar88._0_4_ = fVar6 * fVar86;
      auVar88._4_4_ = fVar6 * fVar91;
      auVar88._8_4_ = fVar6 * fVar92;
      auVar88._12_4_ = fVar6 * fVar93;
      auVar68 = vsubps_avx(auVar88,auVar84);
      local_12b8._0_4_ = auVar65._0_4_;
      local_12b8._4_4_ = auVar65._4_4_;
      fStack_12b0 = auVar65._8_4_;
      fStack_12ac = auVar65._12_4_;
      auVar81._0_4_ = auVar75._0_4_ * fVar8 + fVar6 * (float)local_12b8 + auVar76._0_4_ * fVar7;
      auVar81._4_4_ = auVar75._4_4_ * fVar8 + fVar6 * local_12b8._4_4_ + auVar76._4_4_ * fVar7;
      auVar81._8_4_ = auVar75._8_4_ * fVar8 + fVar6 * fStack_12b0 + auVar76._8_4_ * fVar7;
      auVar81._12_4_ = auVar75._12_4_ * fVar8 + fVar6 * fStack_12ac + auVar76._12_4_ * fVar7;
      local_1298 = auVar67._0_4_;
      fStack_1294 = auVar67._4_4_;
      fStack_1290 = auVar67._8_4_;
      fStack_128c = auVar67._12_4_;
      auVar70._8_4_ = 0x80000000;
      auVar70._0_8_ = 0x8000000080000000;
      auVar70._12_4_ = 0x80000000;
      auVar65 = vandps_avx(auVar81,auVar70);
      uVar49 = auVar65._0_4_;
      auVar89._0_4_ =
           (float)(uVar49 ^ (uint)(local_1298 * fVar40 +
                                  auVar68._0_4_ * fVar24 + auVar66._0_4_ * fVar32));
      uVar72 = auVar65._4_4_;
      auVar89._4_4_ =
           (float)(uVar72 ^ (uint)(fStack_1294 * fVar41 +
                                  auVar68._4_4_ * fVar25 + auVar66._4_4_ * fVar33));
      uVar73 = auVar65._8_4_;
      auVar89._8_4_ =
           (float)(uVar73 ^ (uint)(fStack_1290 * fVar42 +
                                  auVar68._8_4_ * fVar26 + auVar66._8_4_ * fVar34));
      uVar74 = auVar65._12_4_;
      auVar89._12_4_ =
           (float)(uVar74 ^ (uint)(fStack_128c * fVar43 +
                                  auVar68._12_4_ * fVar27 + auVar66._12_4_ * fVar35));
      auVar78._0_4_ =
           (float)(uVar49 ^ (uint)(local_1298 * fVar44 +
                                  auVar68._0_4_ * fVar36 + auVar66._0_4_ * fVar28));
      auVar78._4_4_ =
           (float)(uVar72 ^ (uint)(fStack_1294 * fVar45 +
                                  auVar68._4_4_ * fVar37 + auVar66._4_4_ * fVar29));
      auVar78._8_4_ =
           (float)(uVar73 ^ (uint)(fStack_1290 * fVar46 +
                                  auVar68._8_4_ * fVar38 + auVar66._8_4_ * fVar30));
      auVar78._12_4_ =
           (float)(uVar74 ^ (uint)(fStack_128c * fVar47 +
                                  auVar68._12_4_ * fVar39 + auVar66._12_4_ * fVar31));
      auVar67 = ZEXT816(0) << 0x20;
      auVar65 = vcmpps_avx(auVar89,auVar67,5);
      auVar66 = vcmpps_avx(auVar78,auVar67,5);
      auVar65 = vandps_avx(auVar65,auVar66);
      auVar66 = vcmpps_avx(auVar81,auVar67,4);
      auVar65 = vandps_avx(auVar65,auVar66);
      auVar79._0_4_ = auVar89._0_4_ + auVar78._0_4_;
      auVar79._4_4_ = auVar89._4_4_ + auVar78._4_4_;
      auVar79._8_4_ = auVar89._8_4_ + auVar78._8_4_;
      auVar79._12_4_ = auVar89._12_4_ + auVar78._12_4_;
      auVar90._8_4_ = 0x7fffffff;
      auVar90._0_8_ = 0x7fffffff7fffffff;
      auVar90._12_4_ = 0x7fffffff;
      auVar66 = vandps_avx(auVar81,auVar90);
      auVar67 = vcmpps_avx(auVar79,auVar66,2);
      auVar68 = auVar67 & auVar65;
      if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar68[0xf] < '\0'
         ) {
        auVar65 = vandps_avx(auVar65,auVar67);
        auVar71._0_4_ =
             uVar49 ^ (uint)(auVar75._0_4_ * fVar86 +
                            fVar10 * (float)local_12b8 + fVar9 * auVar76._0_4_);
        auVar71._4_4_ =
             uVar72 ^ (uint)(auVar75._4_4_ * fVar91 +
                            fVar12 * local_12b8._4_4_ + fVar11 * auVar76._4_4_);
        auVar71._8_4_ =
             uVar73 ^ (uint)(auVar75._8_4_ * fVar92 + fVar14 * fStack_12b0 + fVar13 * auVar76._8_4_)
        ;
        auVar71._12_4_ =
             uVar74 ^ (uint)(auVar75._12_4_ * fVar93 +
                            fVar16 * fStack_12ac + fVar15 * auVar76._12_4_);
        fVar6 = *(float *)(ray + k * 4 + 0x30);
        auVar85._0_4_ = auVar66._0_4_ * fVar6;
        auVar85._4_4_ = auVar66._4_4_ * fVar6;
        auVar85._8_4_ = auVar66._8_4_ * fVar6;
        auVar85._12_4_ = auVar66._12_4_ * fVar6;
        auVar67 = vcmpps_avx(auVar85,auVar71,1);
        fVar6 = *(float *)(ray + k * 4 + 0x80);
        auVar82._0_4_ = auVar66._0_4_ * fVar6;
        auVar82._4_4_ = auVar66._4_4_ * fVar6;
        auVar82._8_4_ = auVar66._8_4_ * fVar6;
        auVar82._12_4_ = auVar66._12_4_ * fVar6;
        auVar66 = vcmpps_avx(auVar71,auVar82,2);
        auVar66 = vandps_avx(auVar67,auVar66);
        auVar65 = vandps_avx(auVar66,auVar65);
        iVar58 = vmovmskps_avx(auVar65);
        if (iVar58 != 0) {
          local_12b8._0_1_ = (byte)iVar58;
          local_12b8 = (ulong)(byte)local_12b8;
          do {
            uVar57 = 0;
            if (local_12b8 != 0) {
              for (; (local_12b8 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
              }
            }
            if ((((context->scene->geometries).items[*(uint *)(lVar51 + uVar50 + 0x90 + uVar57 * 4)]
                 .ptr)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
              goto LAB_00fd6045;
            }
            local_12b8 = local_12b8 ^ 1L << (uVar57 & 0x3f);
          } while (local_12b8 != 0);
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }